

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaK_jump(FuncState *fs)

{
  int l2;
  int j;
  int local_1c;
  
  l2 = fs->jpc;
  fs->jpc = -1;
  local_1c = luaK_code(fs,0x7fff8016,fs->ls->lastline);
  luaK_concat(fs,&local_1c,l2);
  return local_1c;
}

Assistant:

static int luaK_jump(FuncState*fs){
int jpc=fs->jpc;
int j;
fs->jpc=(-1);
j=luaK_codeAsBx(fs,OP_JMP,0,(-1));
luaK_concat(fs,&j,jpc);
return j;
}